

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SViewFrustum.h
# Opt level: O0

void __thiscall irr::scene::SViewFrustum::recalculateBoundingSphere(SViewFrustum *this)

{
  vector3d<float> *in_RDI;
  float fVar1;
  vector3df vVar2;
  vector3d<float> vVar3;
  float longest;
  float diam [8];
  u32 i;
  vector3df dir [8];
  float neartocenter;
  float fartocenter;
  float farlen;
  float longlen;
  float shortlen;
  vector3d<float> *in_stack_fffffffffffffc20;
  SViewFrustum *in_stack_fffffffffffffc30;
  SViewFrustum *this_00;
  vector3d<float> *local_3c8;
  float local_3bc;
  float local_3b8 [9];
  uint local_394;
  vector3d<float> local_390;
  vector3df local_380;
  undefined8 local_370;
  float local_368;
  undefined8 local_364;
  float local_35c;
  vector3d<float> local_358;
  vector3df local_348;
  undefined8 local_338;
  float local_330;
  undefined8 local_328;
  float local_320;
  vector3d<float> local_318;
  vector3df local_308;
  undefined8 local_2f8;
  float local_2f0;
  undefined8 local_2e8;
  float local_2e0;
  vector3d<float> local_2d8;
  vector3df local_2c8;
  undefined8 local_2b8;
  float local_2b0;
  undefined8 local_2a8;
  float local_2a0;
  vector3d<float> local_298;
  vector3df local_288;
  undefined8 local_278;
  float local_270;
  undefined8 local_268;
  float local_260;
  vector3d<float> local_258;
  vector3df local_248;
  undefined8 local_238;
  float local_230;
  undefined8 local_228;
  float local_220;
  vector3d<float> local_218;
  vector3df local_208;
  undefined8 local_1f8;
  float local_1f0;
  undefined8 local_1e8;
  float local_1e0;
  vector3d<float> local_1d8;
  vector3df local_1c8;
  undefined8 local_1b8;
  float local_1b0;
  vector3d<float> local_1a8;
  vector3d<float> local_198;
  undefined8 local_18c;
  float local_184;
  undefined8 local_180;
  float local_178;
  undefined8 local_174;
  float local_16c;
  undefined8 local_168;
  float local_160;
  undefined8 local_15c;
  float local_154;
  undefined8 local_150;
  float local_148;
  undefined8 local_144;
  float local_13c;
  undefined1 auStack_138 [24];
  plane3d<float> local_120;
  plane3d<float> local_110;
  plane3d<float> local_100;
  plane3d<float> local_f0;
  float local_e0;
  float fStack_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  vector3d<float> local_c8;
  vector3df local_b8;
  float local_a8 [2];
  float local_a0;
  vector3df local_98;
  float local_88 [2];
  float local_80;
  float local_78;
  float fStack_74;
  float local_70;
  float local_6c;
  vector3d<float> local_68;
  vector3df local_58;
  float local_48 [2];
  float local_40;
  vector3df local_38;
  float local_28;
  float fStack_24;
  float local_20;
  float local_18 [2];
  float local_10;
  float local_c;
  
  vVar2 = getNearLeftUp(in_stack_fffffffffffffc30);
  local_38.Z = vVar2.Z;
  local_20 = local_38.Z;
  local_38._0_8_ = vVar2._0_8_;
  local_28 = local_38.X;
  fStack_24 = local_38.Y;
  local_38 = vVar2;
  vVar2 = getNearRightUp(in_stack_fffffffffffffc30);
  local_58.Z = vVar2.Z;
  local_40 = local_58.Z;
  local_58._0_8_ = vVar2._0_8_;
  local_48[0] = local_58.X;
  local_48[1] = local_58.Y;
  local_58 = vVar2;
  vVar3 = core::vector3d<float>::operator-(&in_stack_fffffffffffffc30->cameraPosition,in_RDI);
  local_68.Z = vVar3.Z;
  local_10 = local_68.Z;
  local_68._0_8_ = vVar3._0_8_;
  local_18[0] = local_68.X;
  local_18[1] = local_68.Y;
  local_68 = vVar3;
  local_c = core::vector3d<float>::getLength((vector3d<float> *)0x2f429d);
  vVar2 = getFarLeftUp(in_stack_fffffffffffffc30);
  local_98.Z = vVar2.Z;
  local_80 = local_98.Z;
  local_98._0_8_ = vVar2._0_8_;
  local_88[0] = local_98.X;
  local_88[1] = local_98.Y;
  local_98 = vVar2;
  vVar2 = getFarRightUp(in_stack_fffffffffffffc30);
  local_b8.Z = vVar2.Z;
  local_a0 = local_b8.Z;
  local_b8._0_8_ = vVar2._0_8_;
  local_a8[0] = local_b8.X;
  local_a8[1] = local_b8.Y;
  local_b8 = vVar2;
  vVar3 = core::vector3d<float>::operator-(&in_stack_fffffffffffffc30->cameraPosition,in_RDI);
  local_c8.Z = vVar3.Z;
  local_70 = local_c8.Z;
  local_c8._0_8_ = vVar3._0_8_;
  local_78 = local_c8.X;
  fStack_74 = local_c8.Y;
  local_c8 = vVar3;
  local_6c = core::vector3d<float>::getLength((vector3d<float> *)0x2f436c);
  local_cc = in_RDI[0x16].X;
  local_d0 = (local_cc + ((local_c - local_6c) * (local_c + local_6c)) / (local_cc * 4.0)) * 0.5;
  local_d4 = local_cc - local_d0;
  vVar3 = core::vector3d<float>::operator-(in_stack_fffffffffffffc20);
  local_110.Normal.Z = vVar3.Z;
  local_100.Normal.Z = local_110.Normal.Z;
  local_110.Normal._0_8_ = vVar3._0_8_;
  local_100.Normal.X = local_110.Normal.X;
  local_100.Normal.Y = local_110.Normal.Y;
  local_110.Normal = vVar3;
  vVar3 = core::vector3d<float>::operator*
                    (&in_stack_fffffffffffffc30->cameraPosition,(float)((ulong)in_RDI >> 0x20));
  local_120.Normal.Z = vVar3.Z;
  local_f0.Normal.Z = local_120.Normal.Z;
  local_120.Normal._0_8_ = vVar3._0_8_;
  local_f0.Normal.X = local_120.Normal.X;
  local_f0.Normal.Y = local_120.Normal.Y;
  local_120.Normal = vVar3;
  vVar3 = core::vector3d<float>::operator+(&in_stack_fffffffffffffc30->cameraPosition,in_RDI);
  auStack_138._8_8_ = vVar3._0_8_;
  local_e0 = (float)auStack_138._8_4_;
  fStack_dc = (float)auStack_138._12_4_;
  auStack_138._16_4_ = vVar3.Z;
  local_d8 = (float)auStack_138._16_4_;
  in_RDI[0x16].Y = (float)auStack_138._8_4_;
  in_RDI[0x16].Z = (float)auStack_138._12_4_;
  in_RDI[0x17].X = (float)auStack_138._16_4_;
  local_3c8 = &local_198;
  this_00 = (SViewFrustum *)auStack_138;
  auStack_138._8_12_ = (undefined1  [12])vVar3;
  do {
    core::vector3d<float>::vector3d(local_3c8);
    local_3c8 = local_3c8 + 1;
  } while ((SViewFrustum *)local_3c8 != this_00);
  vVar2 = getFarLeftUp(this_00);
  local_1c8.Z = vVar2.Z;
  local_1b0 = local_1c8.Z;
  local_1c8._0_8_ = vVar2._0_8_;
  local_1b8._0_4_ = local_1c8.X;
  local_1b8._4_4_ = local_1c8.Y;
  local_1c8 = vVar2;
  vVar3 = core::vector3d<float>::operator-(&this_00->cameraPosition,in_RDI);
  local_1d8.Z = vVar3.Z;
  local_1a8.Z = local_1d8.Z;
  local_1d8._0_8_ = vVar3._0_8_;
  local_1a8.X = local_1d8.X;
  local_1a8.Y = local_1d8.Y;
  local_198.Z = local_1d8.Z;
  local_198.X = local_1d8.X;
  local_198.Y = local_1d8.Y;
  local_1d8 = vVar3;
  vVar2 = getFarRightUp(this_00);
  local_208.Z = vVar2.Z;
  local_1f0 = local_208.Z;
  local_208._0_8_ = vVar2._0_8_;
  local_1f8._0_4_ = local_208.X;
  local_1f8._4_4_ = local_208.Y;
  local_208 = vVar2;
  vVar3 = core::vector3d<float>::operator-(&this_00->cameraPosition,in_RDI);
  local_218.Z = vVar3.Z;
  local_1e0 = local_218.Z;
  local_218._0_8_ = vVar3._0_8_;
  local_1e8._0_4_ = local_218.X;
  local_1e8._4_4_ = local_218.Y;
  local_184 = local_218.Z;
  local_18c._0_4_ = local_218.X;
  local_18c._4_4_ = local_218.Y;
  local_218 = vVar3;
  vVar2 = getFarLeftDown(this_00);
  local_248.Z = vVar2.Z;
  local_230 = local_248.Z;
  local_248._0_8_ = vVar2._0_8_;
  local_238._0_4_ = local_248.X;
  local_238._4_4_ = local_248.Y;
  local_248 = vVar2;
  vVar3 = core::vector3d<float>::operator-(&this_00->cameraPosition,in_RDI);
  local_258.Z = vVar3.Z;
  local_220 = local_258.Z;
  local_258._0_8_ = vVar3._0_8_;
  local_228._0_4_ = local_258.X;
  local_228._4_4_ = local_258.Y;
  local_178 = local_258.Z;
  local_180._0_4_ = local_258.X;
  local_180._4_4_ = local_258.Y;
  local_258 = vVar3;
  vVar2 = getFarRightDown(this_00);
  local_288.Z = vVar2.Z;
  local_270 = local_288.Z;
  local_288._0_8_ = vVar2._0_8_;
  local_278._0_4_ = local_288.X;
  local_278._4_4_ = local_288.Y;
  local_288 = vVar2;
  vVar3 = core::vector3d<float>::operator-(&this_00->cameraPosition,in_RDI);
  local_298.Z = vVar3.Z;
  local_260 = local_298.Z;
  local_298._0_8_ = vVar3._0_8_;
  local_268._0_4_ = local_298.X;
  local_268._4_4_ = local_298.Y;
  local_16c = local_298.Z;
  local_174._0_4_ = local_298.X;
  local_174._4_4_ = local_298.Y;
  local_298 = vVar3;
  vVar2 = getNearRightDown(this_00);
  local_2c8.Z = vVar2.Z;
  local_2b0 = local_2c8.Z;
  local_2c8._0_8_ = vVar2._0_8_;
  local_2b8._0_4_ = local_2c8.X;
  local_2b8._4_4_ = local_2c8.Y;
  local_2c8 = vVar2;
  vVar3 = core::vector3d<float>::operator-(&this_00->cameraPosition,in_RDI);
  local_2d8.Z = vVar3.Z;
  local_2a0 = local_2d8.Z;
  local_2d8._0_8_ = vVar3._0_8_;
  local_2a8._0_4_ = local_2d8.X;
  local_2a8._4_4_ = local_2d8.Y;
  local_160 = local_2d8.Z;
  local_168._0_4_ = local_2d8.X;
  local_168._4_4_ = local_2d8.Y;
  local_2d8 = vVar3;
  vVar2 = getNearLeftDown(this_00);
  local_308.Z = vVar2.Z;
  local_2f0 = local_308.Z;
  local_308._0_8_ = vVar2._0_8_;
  local_2f8._0_4_ = local_308.X;
  local_2f8._4_4_ = local_308.Y;
  local_308 = vVar2;
  vVar3 = core::vector3d<float>::operator-(&this_00->cameraPosition,in_RDI);
  local_318.Z = vVar3.Z;
  local_2e0 = local_318.Z;
  local_318._0_8_ = vVar3._0_8_;
  local_2e8._0_4_ = local_318.X;
  local_2e8._4_4_ = local_318.Y;
  local_154 = local_318.Z;
  local_15c._0_4_ = local_318.X;
  local_15c._4_4_ = local_318.Y;
  local_318 = vVar3;
  vVar2 = getNearRightUp(this_00);
  local_348.Z = vVar2.Z;
  local_330 = local_348.Z;
  local_348._0_8_ = vVar2._0_8_;
  local_338._0_4_ = local_348.X;
  local_338._4_4_ = local_348.Y;
  local_348 = vVar2;
  vVar3 = core::vector3d<float>::operator-(&this_00->cameraPosition,in_RDI);
  local_358.Z = vVar3.Z;
  local_320 = local_358.Z;
  local_358._0_8_ = vVar3._0_8_;
  local_328._0_4_ = local_358.X;
  local_328._4_4_ = local_358.Y;
  local_148 = local_358.Z;
  local_150._0_4_ = local_358.X;
  local_150._4_4_ = local_358.Y;
  local_358 = vVar3;
  vVar2 = getNearLeftUp(this_00);
  local_380.Z = vVar2.Z;
  local_368 = local_380.Z;
  local_380._0_8_ = vVar2._0_8_;
  local_370._0_4_ = local_380.X;
  local_370._4_4_ = local_380.Y;
  local_380 = vVar2;
  vVar3 = core::vector3d<float>::operator-(&this_00->cameraPosition,in_RDI);
  local_390._0_8_ = vVar3._0_8_;
  local_364._0_4_ = local_390.X;
  local_364._4_4_ = local_390.Y;
  local_390.Z = vVar3.Z;
  local_35c = local_390.Z;
  local_144._0_4_ = local_390.X;
  local_144._4_4_ = local_390.Y;
  local_13c = local_390.Z;
  local_394 = 0;
  local_390 = vVar3;
  memset(local_3b8,0,0x20);
  for (local_394 = 0; local_394 < 8; local_394 = local_394 + 1) {
    fVar1 = core::vector3d<float>::getLengthSQ(&local_198 + local_394);
    local_3b8[local_394] = fVar1;
  }
  local_3bc = 0.0;
  for (local_394 = 0; local_394 < 8; local_394 = local_394 + 1) {
    if (local_3bc < local_3b8[local_394]) {
      local_3bc = local_3b8[local_394];
    }
  }
  fVar1 = sqrtf(local_3bc);
  in_RDI[0x15].Z = fVar1;
  return;
}

Assistant:

inline void SViewFrustum::recalculateBoundingSphere()
{
	// Find the center
	const float shortlen = (getNearLeftUp() - getNearRightUp()).getLength();
	const float longlen = (getFarLeftUp() - getFarRightUp()).getLength();

	const float farlen = FarNearDistance;
	const float fartocenter = (farlen + (shortlen - longlen) * (shortlen + longlen) / (4 * farlen)) / 2;
	const float neartocenter = farlen - fartocenter;

	BoundingCenter = cameraPosition + -planes[VF_NEAR_PLANE].Normal * neartocenter;

	// Find the radius
	core::vector3df dir[8];
	dir[0] = getFarLeftUp() - BoundingCenter;
	dir[1] = getFarRightUp() - BoundingCenter;
	dir[2] = getFarLeftDown() - BoundingCenter;
	dir[3] = getFarRightDown() - BoundingCenter;
	dir[4] = getNearRightDown() - BoundingCenter;
	dir[5] = getNearLeftDown() - BoundingCenter;
	dir[6] = getNearRightUp() - BoundingCenter;
	dir[7] = getNearLeftUp() - BoundingCenter;

	u32 i = 0;
	float diam[8] = {0.f};

	for (i = 0; i < 8; ++i)
		diam[i] = dir[i].getLengthSQ();

	float longest = 0;

	for (i = 0; i < 8; ++i) {
		if (diam[i] > longest)
			longest = diam[i];
	}

	BoundingRadius = sqrtf(longest);
}